

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SwapChainVkImpl.cpp
# Opt level: O1

void __thiscall Diligent::SwapChainVkImpl::CreateVulkanSwapChain(SwapChainVkImpl *this)

{
  Uint32 *pUVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  uint uVar3;
  SWAP_CHAIN_USAGE_FLAGS SVar4;
  VkPhysicalDevice pVVar5;
  VkSwapchainKHR pVVar6;
  VkDevice pVVar7;
  pointer pRVar8;
  VkPresentModeKHR *pVVar9;
  RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>
  RVar10;
  RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>
  *pRVar11;
  undefined8 uVar12;
  VkColorSpaceKHR VVar13;
  TEXTURE_FORMAT Format;
  VkResult VVar14;
  VkFormat VVar15;
  VkSurfaceTransformFlagBitsKHR VVar16;
  SURFACE_TRANSFORM SVar17;
  TextureFormatAttribs *pTVar18;
  __normal_iterator<VkPresentModeKHR_*,_std::vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>_>
  _Var19;
  VkCompositeAlphaFlagBitsKHR VVar20;
  VkSurfaceFormatKHR *SrfFmt_1;
  char (*Args_1) [16];
  char (*Args_1_00) [39];
  char (*Args_1_01) [21];
  char (*Args_1_02) [164];
  char (*Args_1_03) [24];
  iterator __end3;
  ulong uVar21;
  bool bVar22;
  long lVar23;
  char *in_R8;
  VkSurfaceFormatKHR *SrfFmt;
  char *in_R9;
  VkPresentModeKHR *pVVar24;
  VkColorSpaceKHR VVar25;
  undefined4 uVar26;
  uint uVar27;
  VkPresentModeKHR VVar28;
  VkExtent2D VVar29;
  Uint32 UVar30;
  bool bVar31;
  uint32_t swapchainImageCount;
  uint32_t formatCount;
  uint32_t presentModeCount;
  char *PresentModeName;
  VkSwapchainCreateInfoKHR swapchain_ci;
  vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_> presentModes;
  vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_> SupportedFormats;
  VkSurfaceCapabilitiesKHR surfCapabilities;
  string msg;
  VkSemaphoreCreateInfo SemaphoreCI;
  SemaphoreWrapper Semaphore;
  string *in_stack_fffffffffffffcd8;
  string *psVar32;
  SwapChainVkImpl *pSVar33;
  vector<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>_>_>
  *this_00;
  uint32_t local_314;
  uint32_t local_310;
  uint32_t local_30c;
  RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>
  local_308;
  RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>
  *local_300;
  long *local_2f8 [2];
  long local_2e8 [2];
  ios_base *local_2d8;
  element_type *local_2d0;
  undefined1 local_2c8 [16];
  VkPresentModeKHR *local_2b8;
  VkSurfaceKHR pVStack_2b0;
  Uint32 local_2a8;
  VkFormat VStack_2a4;
  undefined8 uStack_2a0;
  Uint32 local_298;
  uint32_t uStack_294;
  uint uStack_290;
  VkSharingMode VStack_28c;
  uint32_t uStack_288;
  undefined4 uStack_284;
  uint32_t *puStack_280;
  undefined8 local_278;
  VkPresentModeKHR VStack_270;
  VkBool32 VStack_26c;
  VkSwapchainKHR local_268;
  RenderDeviceVkImpl *local_260;
  vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_> local_258;
  vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_> local_240;
  undefined1 local_228 [8];
  VkExtent2D VStack_220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  undefined8 local_208;
  undefined8 uStack_200;
  VkImageUsageFlags local_1f8;
  undefined1 local_1f0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e0 [7];
  ios_base local_170 [264];
  VkSemaphoreCreateInfo local_68;
  vector<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>_>_>
  *local_50;
  SemaphoreWrapper local_48;
  
  local_260 = RefCntAutoPtr<Diligent::IRenderDevice>::RawPtr<Diligent::RenderDeviceVkImpl>
                        (&(this->super_SwapChainBase<Diligent::ISwapChainVk>).m_pRenderDevice);
  pVVar5 = ((local_260->m_PhysicalDevice)._M_t.
            super___uniq_ptr_impl<VulkanUtilities::VulkanPhysicalDevice,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
            ._M_t.
            super__Tuple_impl<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
            .super__Head_base<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_false>._M_head_impl)->
           m_VkDevice;
  local_310 = 0;
  Args_1 = (char (*) [16])0x0;
  VVar14 = (*vkGetPhysicalDeviceSurfaceFormatsKHR)
                     (pVVar5,this->m_VkSurface,&local_310,(VkSurfaceFormatKHR *)0x0);
  if (VVar14 != VK_SUCCESS) {
    local_1f0._0_8_ = VulkanUtilities::VkResultToString(VVar14);
    in_stack_fffffffffffffcd8 = (string *)local_1f0;
    in_R8 = "Failed to query number of supported formats";
    in_R9 = "\nVK Error Code: ";
    Args_1 = (char (*) [16])0xac;
    LogError<true,char[44],char[17],char_const*>
              (false,"CreateVulkanSwapChain",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/SwapChainVkImpl.cpp"
               ,0xac,(char (*) [44])"Failed to query number of supported formats",
               (char (*) [17])"\nVK Error Code: ",(char **)in_stack_fffffffffffffcd8);
  }
  if (local_310 == 0) {
    FormatString<char[26],char[16]>
              ((string *)local_1f0,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"formatCount > 0",Args_1);
    DebugAssertionFailed
              ((Char *)local_1f0._0_8_,"CreateVulkanSwapChain",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/SwapChainVkImpl.cpp"
               ,0xad);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._0_8_ != &((string *)local_1f0)->field_2) {
      operator_delete((void *)local_1f0._0_8_,local_1e0[0]._M_allocated_capacity + 1);
    }
  }
  psVar32 = (string *)local_1f0;
  std::vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>::vector
            (&local_240,(ulong)local_310,(allocator_type *)psVar32);
  VVar14 = (*vkGetPhysicalDeviceSurfaceFormatsKHR)
                     (pVVar5,this->m_VkSurface,&local_310,
                      local_240.
                      super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>.
                      _M_impl.super__Vector_impl_data._M_start);
  if (VVar14 != VK_SUCCESS) {
    local_1f0._0_8_ = VulkanUtilities::VkResultToString(VVar14);
    in_R8 = "Failed to query supported format properties";
    in_R9 = "\nVK Error Code: ";
    in_stack_fffffffffffffcd8 = psVar32;
    LogError<true,char[44],char[17],char_const*>
              (false,"CreateVulkanSwapChain",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/SwapChainVkImpl.cpp"
               ,0xb0,(char (*) [44])"Failed to query supported format properties",
               (char (*) [17])"\nVK Error Code: ",(char **)psVar32);
  }
  Args_1_00 = (char (*) [39])
              ((long)local_240.
                     super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_240.
                     super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 3);
  if (Args_1_00 != (char (*) [39])(ulong)local_310) {
    FormatString<char[26],char[39]>
              ((string *)local_1f0,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"formatCount == SupportedFormats.size()",Args_1_00);
    DebugAssertionFailed
              ((Char *)local_1f0._0_8_,"CreateVulkanSwapChain",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/SwapChainVkImpl.cpp"
               ,0xb1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._0_8_ != &((string *)local_1f0)->field_2) {
      operator_delete((void *)local_1f0._0_8_,local_1e0[0]._M_allocated_capacity + 1);
    }
  }
  VVar15 = TexFormatToVkFormat((this->super_SwapChainBase<Diligent::ISwapChainVk>).m_SwapChainDesc.
                               ColorBufferFormat);
  this->m_VkColorFormat = VVar15;
  if ((local_310 == 1) &&
     ((local_240.super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>._M_impl
       .super__Vector_impl_data._M_start)->format == 0)) {
    VVar25 = VK_COLORSPACE_SRGB_NONLINEAR_KHR;
  }
  else {
    if (local_240.super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        local_240.super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      bVar22 = false;
      VVar25 = VK_COLORSPACE_SRGB_NONLINEAR_KHR;
    }
    else {
      bVar22 = false;
      in_R8 = (char *)local_240.
                      super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>.
                      _M_impl.super__Vector_impl_data._M_start;
      do {
        bVar31 = *(VkFormat *)&((TextureFormatAttribs *)in_R8)->Name == VVar15;
        if (bVar31) {
          bVar22 = true;
        }
        VVar25 = *(VkColorSpaceKHR *)((long)&((TextureFormatAttribs *)in_R8)->Name + 4);
      } while ((!bVar31) &&
              (in_R8 = (char *)&((TextureFormatAttribs *)in_R8)->Format,
              VVar25 = VK_COLORSPACE_SRGB_NONLINEAR_KHR,
              (pointer)in_R8 !=
              local_240.super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>.
              _M_impl.super__Vector_impl_data._M_finish));
    }
    if (!bVar22) {
      if ((int)VVar15 < 0x2c) {
        if (VVar15 == VK_FORMAT_R8G8B8A8_UNORM) {
          VVar15 = VK_FORMAT_B8G8R8A8_UNORM;
        }
        else if (VVar15 == VK_FORMAT_R8G8B8A8_SRGB) {
          VVar15 = VK_FORMAT_B8G8R8A8_SRGB;
        }
        else {
LAB_0026063b:
          VVar15 = VK_FORMAT_UNDEFINED;
        }
      }
      else if (VVar15 == VK_FORMAT_B8G8R8A8_SRGB) {
        VVar15 = VK_FORMAT_R8G8B8A8_SRGB;
      }
      else {
        if (VVar15 != VK_FORMAT_B8G8R8A8_UNORM) goto LAB_0026063b;
        VVar15 = VK_FORMAT_R8G8B8A8_UNORM;
      }
      bVar22 = false;
      for (pTVar18 = (TextureFormatAttribs *)
                     local_240.
                     super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>.
                     _M_impl.super__Vector_impl_data._M_start; VVar13 = VVar25,
          pTVar18 !=
          (TextureFormatAttribs *)
          local_240.super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>.
          _M_impl.super__Vector_impl_data._M_finish;
          pTVar18 = (TextureFormatAttribs *)&pTVar18->Format) {
        bVar31 = *(VkFormat *)&pTVar18->Name == VVar15;
        if (bVar31) {
          bVar22 = true;
        }
        VVar13 = *(VkColorSpaceKHR *)((long)&pTVar18->Name + 4);
        if (bVar31) break;
      }
      VVar25 = VVar13;
      if (bVar22) {
        this->m_VkColorFormat = VVar15;
        pSVar33 = this;
        Format = VkFormatToTexFormat(VVar15);
        pTVar18 = GetTextureFormatAttribs
                            ((this->super_SwapChainBase<Diligent::ISwapChainVk>).m_SwapChainDesc.
                             ColorBufferFormat);
        in_R8 = (char *)GetTextureFormatAttribs(Format);
        FormatString<char[31],char_const*,char[60],char_const*>
                  ((string *)local_1f0,(Diligent *)"Requested color buffer format ",
                   (char (*) [31])pTVar18,
                   (char **)" is not supported by the surface and will be replaced with ",
                   (char (*) [60])in_R8,(char **)in_R9);
        this = pSVar33;
        if (DebugMessageCallback != (undefined *)0x0) {
          in_R8 = (char *)0x0;
          (*(code *)DebugMessageCallback)(0,local_1f0._0_8_,0,0);
          this = pSVar33;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f0._0_8_ != &((string *)local_1f0)->field_2) {
          operator_delete((void *)local_1f0._0_8_,local_1e0[0]._M_allocated_capacity + 1);
        }
        (this->super_SwapChainBase<Diligent::ISwapChainVk>).m_SwapChainDesc.ColorBufferFormat =
             Format;
      }
      else {
        pTVar18 = GetTextureFormatAttribs
                            ((this->super_SwapChainBase<Diligent::ISwapChainVk>).m_SwapChainDesc.
                             ColorBufferFormat);
        FormatString<char[31],char_const*,char[32]>
                  ((string *)local_1f0,(Diligent *)"Requested color buffer format ",
                   (char (*) [31])pTVar18,(char **)"is not supported by the surface",
                   (char (*) [32])in_R8);
        if (DebugMessageCallback != (undefined *)0x0) {
          in_R8 = (char *)0x0;
          (*(code *)DebugMessageCallback)(1,local_1f0._0_8_,0,0);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f0._0_8_ != &((string *)local_1f0)->field_2) {
          operator_delete((void *)local_1f0._0_8_,local_1e0[0]._M_allocated_capacity + 1);
        }
      }
    }
  }
  local_208._0_4_ = 0;
  local_208._4_4_ = 0;
  uStack_200._0_4_ = 0;
  uStack_200._4_4_ = 0;
  local_218._M_allocated_capacity._0_4_ = 0;
  local_218._M_allocated_capacity._4_4_ = 0;
  local_218._8_4_ = 0;
  local_218._12_4_ = 0;
  local_228 = (undefined1  [8])0x0;
  VStack_220.width = 0;
  VStack_220.height = 0;
  local_1f8 = 0;
  VVar14 = (*vkGetPhysicalDeviceSurfaceCapabilitiesKHR)
                     (pVVar5,this->m_VkSurface,(VkSurfaceCapabilitiesKHR *)local_228);
  if (VVar14 != VK_SUCCESS) {
    local_1f0._0_8_ = VulkanUtilities::VkResultToString(VVar14);
    in_R8 = "Failed to query physical device surface capabilities";
    in_stack_fffffffffffffcd8 = psVar32;
    LogError<true,char[53],char[17],char_const*>
              (false,"CreateVulkanSwapChain",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/SwapChainVkImpl.cpp"
               ,0xf3,(char (*) [53])"Failed to query physical device surface capabilities",
               (char (*) [17])"\nVK Error Code: ",(char **)psVar32);
  }
  local_30c = 0;
  Args_1_01 = (char (*) [21])0x0;
  VVar14 = (*vkGetPhysicalDeviceSurfacePresentModesKHR)
                     (pVVar5,this->m_VkSurface,&local_30c,(VkPresentModeKHR *)0x0);
  if (VVar14 != VK_SUCCESS) {
    local_1f0._0_8_ = VulkanUtilities::VkResultToString(VVar14);
    in_R8 = "Failed to query surface present mode count";
    Args_1_01 = (char (*) [21])0xf8;
    LogError<true,char[43],char[17],char_const*>
              (false,"CreateVulkanSwapChain",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/SwapChainVkImpl.cpp"
               ,0xf8,(char (*) [43])"Failed to query surface present mode count",
               (char (*) [17])"\nVK Error Code: ",(char **)psVar32);
    in_stack_fffffffffffffcd8 = psVar32;
  }
  if (local_30c == 0) {
    FormatString<char[26],char[21]>
              ((string *)local_1f0,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"presentModeCount > 0",Args_1_01);
    DebugAssertionFailed
              ((Char *)local_1f0._0_8_,"CreateVulkanSwapChain",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/SwapChainVkImpl.cpp"
               ,0xf9);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._0_8_ != &((string *)local_1f0)->field_2) {
      operator_delete((void *)local_1f0._0_8_,local_1e0[0]._M_allocated_capacity + 1);
    }
  }
  psVar32 = (string *)local_1f0;
  std::vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>::vector
            (&local_258,(ulong)local_30c,(allocator_type *)psVar32);
  VVar14 = (*vkGetPhysicalDeviceSurfacePresentModesKHR)
                     (pVVar5,this->m_VkSurface,&local_30c,
                      local_258.
                      super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>.
                      _M_impl.super__Vector_impl_data._M_start);
  if (VVar14 != VK_SUCCESS) {
    local_1f0._0_8_ = VulkanUtilities::VkResultToString(VVar14);
    in_R8 = "Failed to query surface present modes";
    LogError<true,char[38],char[17],char_const*>
              (false,"CreateVulkanSwapChain",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/SwapChainVkImpl.cpp"
               ,0xfc,(char (*) [38])"Failed to query surface present modes",
               (char (*) [17])"\nVK Error Code: ",(char **)psVar32);
    in_stack_fffffffffffffcd8 = psVar32;
  }
  Args_1_02 = (char (*) [164])
              ((long)local_258.
                     super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>._M_impl
                     .super__Vector_impl_data._M_finish -
               (long)local_258.
                     super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>._M_impl
                     .super__Vector_impl_data._M_start >> 2);
  if (Args_1_02 != (char (*) [164])(ulong)local_30c) {
    FormatString<char[26],char[40]>
              ((string *)local_1f0,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"presentModeCount == presentModes.size()",(char (*) [40])Args_1_02);
    Args_1_02 = (char (*) [164])0xfd;
    DebugAssertionFailed
              ((Char *)local_1f0._0_8_,"CreateVulkanSwapChain",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/SwapChainVkImpl.cpp"
               ,0xfd);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._0_8_ != &((string *)local_1f0)->field_2) {
      operator_delete((void *)local_1f0._0_8_,local_1e0[0]._M_allocated_capacity + 1);
    }
  }
  SVar17 = (this->super_SwapChainBase<Diligent::ISwapChainVk>).m_DesiredPreTransform;
  if (SVar17 == SURFACE_TRANSFORM_OPTIMAL) {
    VVar16 = VK_SURFACE_TRANSFORM_IDENTITY_BIT_KHR;
  }
  else {
    VVar16 = SurfaceTransformToVkSurfaceTransformFlag(SVar17);
    if ((local_208._4_4_ & VVar16) == 0) {
      local_2c8._0_8_ =
           GetSurfaceTransformString
                     ((this->super_SwapChainBase<Diligent::ISwapChainVk>).m_DesiredPreTransform);
      FormatString<char_const*,char[164]>
                ((string *)local_1f0,(Diligent *)local_2c8,
                 (char **)
                 " is not supported by the presentation engine. Optimal surface transform will be used instead. Query the swap chain description to get the actual surface transform."
                 ,Args_1_02);
      if (DebugMessageCallback != (undefined *)0x0) {
        in_R8 = (char *)0x0;
        (*(code *)DebugMessageCallback)(1,local_1f0._0_8_,0,0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._0_8_ != &((string *)local_1f0)->field_2) {
        operator_delete((void *)local_1f0._0_8_,local_1e0[0]._M_allocated_capacity + 1);
      }
      (this->super_SwapChainBase<Diligent::ISwapChainVk>).m_DesiredPreTransform =
           SURFACE_TRANSFORM_OPTIMAL;
    }
    else {
      (this->super_SwapChainBase<Diligent::ISwapChainVk>).m_SwapChainDesc.PreTransform =
           (this->super_SwapChainBase<Diligent::ISwapChainVk>).m_DesiredPreTransform;
    }
  }
  if ((this->super_SwapChainBase<Diligent::ISwapChainVk>).m_DesiredPreTransform ==
      SURFACE_TRANSFORM_OPTIMAL) {
    VVar16 = (VkSurfaceTransformFlagBitsKHR)uStack_200;
    SVar17 = VkSurfaceTransformFlagToSurfaceTransform((VkSurfaceTransformFlagBitsKHR)uStack_200);
    (this->super_SwapChainBase<Diligent::ISwapChainVk>).m_SwapChainDesc.PreTransform = SVar17;
    local_2c8._0_8_ = GetSurfaceTransformString(SVar17);
    FormatString<char[7],char_const*,char[25]>
              ((string *)local_1f0,(Diligent *)"Using ",(char (*) [7])local_2c8,
               (char **)" swap chain pretransform",(char (*) [25])in_R8);
    if (DebugMessageCallback != (undefined *)0x0) {
      in_R8 = (char *)0x0;
      (*(code *)DebugMessageCallback)(0,local_1f0._0_8_,0,0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._0_8_ != &((string *)local_1f0)->field_2) {
      operator_delete((void *)local_1f0._0_8_,local_1e0[0]._M_allocated_capacity + 1);
    }
  }
  uVar27 = (this->super_SwapChainBase<Diligent::ISwapChainVk>).m_SwapChainDesc.Width;
  if ((uVar27 == 0 || VStack_220.width != 0xffffffff) ||
     (uVar3 = (this->super_SwapChainBase<Diligent::ISwapChainVk>).m_SwapChainDesc.Height, uVar3 == 0
     )) {
    VVar29 = VStack_220;
    uVar26 = VStack_220.height;
  }
  else {
    uVar26 = local_218._M_allocated_capacity._0_4_;
    if ((uint)local_218._M_allocated_capacity._0_4_ <= uVar27) {
      uVar26 = (this->super_SwapChainBase<Diligent::ISwapChainVk>).m_SwapChainDesc.Width;
    }
    if ((uint)local_218._8_4_ < (uint)uVar26) {
      uVar26 = local_218._8_4_;
    }
    VVar29.height = 0;
    VVar29.width = uVar26;
    uVar26 = local_218._M_allocated_capacity._4_4_;
    if ((uint)local_218._M_allocated_capacity._4_4_ <= uVar3) {
      uVar26 = (this->super_SwapChainBase<Diligent::ISwapChainVk>).m_SwapChainDesc.Height;
    }
    if ((uint)local_218._12_4_ < (uint)uVar26) {
      uVar26 = local_218._12_4_;
    }
  }
  uVar27 = VVar29.width + (uint)(VVar29.width == 0);
  UVar30 = uVar26 + (uint)(uVar26 == 0);
  (this->super_SwapChainBase<Diligent::ISwapChainVk>).m_SwapChainDesc.Width = uVar27;
  (this->super_SwapChainBase<Diligent::ISwapChainVk>).m_SwapChainDesc.Height = UVar30;
  local_2c8._0_8_ = (VkPresentModeKHR *)0x0;
  local_2c8._8_8_ = (VkPresentModeKHR *)0x0;
  local_2b8 = (VkPresentModeKHR *)0x0;
  if (this->m_VSyncEnabled == true) {
    local_1f0._0_4_ = 3;
    std::vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>::
    _M_realloc_insert<VkPresentModeKHR>
              ((vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_> *)local_2c8,
               (iterator)0x0,(VkPresentModeKHR *)local_1f0);
    local_1f0._0_4_ = 2;
    if ((VkPresentModeKHR *)local_2c8._8_8_ == local_2b8) {
      std::vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>::
      _M_realloc_insert<VkPresentModeKHR>
                ((vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_> *)local_2c8,
                 (iterator)local_2c8._8_8_,(VkPresentModeKHR *)local_1f0);
      goto LAB_00260cbd;
    }
  }
  else {
    local_1f0._0_4_ = 1;
    std::vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>::
    _M_realloc_insert<VkPresentModeKHR>
              ((vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_> *)local_2c8,
               (iterator)0x0,(VkPresentModeKHR *)local_1f0);
    local_1f0._0_4_ = 0;
    if ((VkPresentModeKHR *)local_2c8._8_8_ == local_2b8) {
      std::vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>::
      _M_realloc_insert<VkPresentModeKHR>
                ((vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_> *)local_2c8,
                 (iterator)local_2c8._8_8_,(VkPresentModeKHR *)local_1f0);
    }
    else {
      *(VkPresentModeKHR *)local_2c8._8_8_ = VK_PRESENT_MODE_IMMEDIATE_KHR;
      local_2c8._8_8_ = local_2c8._8_8_ + 4;
    }
    local_1f0._0_4_ = 2;
    if ((VkPresentModeKHR *)local_2c8._8_8_ == local_2b8) {
      std::vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>::
      _M_realloc_insert<VkPresentModeKHR>
                ((vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_> *)local_2c8,
                 (iterator)local_2c8._8_8_,(VkPresentModeKHR *)local_1f0);
      goto LAB_00260cbd;
    }
  }
  *(VkPresentModeKHR *)local_2c8._8_8_ = VK_PRESENT_MODE_FIFO_KHR;
  local_2c8._8_8_ = local_2c8._8_8_ + 4;
LAB_00260cbd:
  uVar12 = local_2c8._8_8_;
  local_2d0 = (element_type *)CONCAT44(local_2d0._4_4_,VVar16);
  local_2d8 = (ios_base *)(ulong)uVar27;
  if (local_2c8._0_8_ == local_2c8._8_8_) {
    VVar28 = VK_PRESENT_MODE_FIFO_KHR;
  }
  else {
    VVar28 = VK_PRESENT_MODE_FIFO_KHR;
    pVVar9 = (VkPresentModeKHR *)local_2c8._0_8_;
    do {
      pVVar24 = pVVar9 + 1;
      local_1f0._0_4_ = *pVVar9;
      _Var19 = std::
               __find_if<__gnu_cxx::__normal_iterator<VkPresentModeKHR*,std::vector<VkPresentModeKHR,std::allocator<VkPresentModeKHR>>>,__gnu_cxx::__ops::_Iter_equals_val<VkPresentModeKHR_const>>
                         (local_258.
                          super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          local_258.
                          super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>.
                          _M_impl.super__Vector_impl_data._M_finish,(string *)local_1f0);
      if (_Var19._M_current !=
          local_258.super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        VVar28 = local_1f0._0_4_;
        break;
      }
      pVVar9 = pVVar24;
    } while (pVVar24 != (VkPresentModeKHR *)uVar12);
  }
  switch(VVar28) {
  case VK_PRESENT_MODE_IMMEDIATE_KHR:
    local_2f8[0] = (long *)0x6d9b42;
    break;
  case VK_PRESENT_MODE_MAILBOX_KHR:
    local_2f8[0] = (long *)0x6d9b60;
    break;
  case VK_PRESENT_MODE_FIFO_KHR:
    local_2f8[0] = (long *)0x6d9b7c;
    break;
  case VK_PRESENT_MODE_FIFO_RELAXED_KHR:
    local_2f8[0] = (long *)0x6d9b95;
    break;
  default:
    if (VVar28 == VK_PRESENT_MODE_SHARED_DEMAND_REFRESH_KHR) {
      local_2f8[0] = (long *)0x6d9bb6;
    }
    else if (VVar28 == VK_PRESENT_MODE_SHARED_CONTINUOUS_REFRESH_KHR) {
      local_2f8[0] = (long *)0x6d9be0;
    }
    else {
      local_2f8[0] = (long *)0x6d9c0e;
    }
  }
  FormatString<char[7],char_const*,char[25]>
            ((string *)local_1f0,(Diligent *)"Using ",(char (*) [7])local_2f8,
             (char **)" swap chain present mode",(char (*) [25])in_R8);
  if (DebugMessageCallback != (undefined *)0x0) {
    (*(code *)DebugMessageCallback)(0,local_1f0._0_8_,0,0,0);
  }
  paVar2 = &((string *)local_1f0)->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._0_8_ != paVar2) {
    operator_delete((void *)local_1f0._0_8_,local_1e0[0]._M_allocated_capacity + 1);
  }
  if ((VkPresentModeKHR *)local_2c8._0_8_ != (VkPresentModeKHR *)0x0) {
    operator_delete((void *)local_2c8._0_8_,(long)local_2b8 - local_2c8._0_8_);
  }
  pUVar1 = &this->m_DesiredBufferCount;
  if (this->m_DesiredBufferCount < (uint)local_228._0_4_) {
    in_stack_fffffffffffffcd8 = (string *)local_228;
    FormatString<char[28],unsigned_int,char[71],unsigned_int,char[17],unsigned_int>
              ((string *)local_1f0,(Diligent *)"Desired back buffer count (",(char (*) [28])pUVar1,
               (uint *)") is smaller than the minimal image count supported for this surface (",
               (char (*) [71])in_stack_fffffffffffffcd8,(uint *)"). Resetting to ",
               (char (*) [17])in_stack_fffffffffffffcd8,(uint *)this);
    if (DebugMessageCallback != (undefined *)0x0) {
      (*(code *)DebugMessageCallback)(0,local_1f0._0_8_,0,0,0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._0_8_ != paVar2) {
      operator_delete((void *)local_1f0._0_8_,local_1e0[0]._M_allocated_capacity + 1);
    }
    *pUVar1 = local_228._0_4_;
  }
  if ((local_228._4_4_ != 0) && ((uint)local_228._4_4_ < *pUVar1)) {
    in_stack_fffffffffffffcd8 = (string *)(local_228 + 4);
    FormatString<char[28],unsigned_int,char[71],unsigned_int,char[17],unsigned_int>
              ((string *)local_1f0,(Diligent *)"Desired back buffer count (",(char (*) [28])pUVar1,
               (uint *)") is greater than the maximal image count supported for this surface (",
               (char (*) [71])in_stack_fffffffffffffcd8,(uint *)"). Resetting to ",
               (char (*) [17])in_stack_fffffffffffffcd8,(uint *)this);
    if (DebugMessageCallback != (undefined *)0x0) {
      (*(code *)DebugMessageCallback)(0,local_1f0._0_8_,0,0,0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._0_8_ != paVar2) {
      operator_delete((void *)local_1f0._0_8_,local_1e0[0]._M_allocated_capacity + 1);
    }
    *pUVar1 = local_228._4_4_;
  }
  local_2a8 = *pUVar1;
  lVar23 = 0;
  do {
    VVar20 = *(VkCompositeAlphaFlagBitsKHR *)((long)&DAT_006d94f0 + lVar23);
    if ((VVar20 & uStack_200._4_4_) != 0) goto LAB_00260f57;
    lVar23 = lVar23 + 4;
  } while (lVar23 != 0x10);
  VVar20 = VK_COMPOSITE_ALPHA_OPAQUE_BIT_KHR;
LAB_00260f57:
  pVVar6 = this->m_VkSwapChain;
  this->m_VkSwapChain = (VkSwapchainKHR)0x0;
  uStack_288 = 0;
  uStack_284 = 0;
  puStack_280 = (uint32_t *)0x0;
  uStack_290 = 0;
  VStack_28c = VK_SHARING_MODE_EXCLUSIVE;
  local_2b8 = (pointer)0x0;
  local_2c8._0_8_ = (pointer)0x3b9acde8;
  local_2c8._8_8_ = (pointer)0x0;
  pVStack_2b0 = this->m_VkSurface;
  VStack_2a4 = this->m_VkColorFormat;
  local_278._4_4_ = VVar20;
  local_278._0_4_ = (VkSurfaceTransformFlagBitsKHR)local_2d0;
  uStack_294 = 1;
  local_298 = UVar30;
  VStack_26c = 1;
  VStack_270 = VVar28;
  uStack_2a0._4_4_ = (uint32_t)local_2d8;
  uStack_2a0._0_4_ = VVar25;
  local_268 = pVVar6;
  if ((this->super_SwapChainBase<Diligent::ISwapChainVk>).m_SwapChainDesc.Usage ==
      SWAP_CHAIN_USAGE_NONE) {
    FormatString<char[34]>((string *)local_1f0,(char (*) [34])"No swap chain usage flags defined");
    DebugAssertionFailed
              ((Char *)local_1f0._0_8_,"CreateVulkanSwapChain",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/SwapChainVkImpl.cpp"
               ,0x1b4);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._0_8_ != paVar2) {
      operator_delete((void *)local_1f0._0_8_,local_1e0[0]._M_allocated_capacity + 1);
    }
  }
  SVar4 = (this->super_SwapChainBase<Diligent::ISwapChainVk>).m_SwapChainDesc.Usage;
  if ((SVar4 & SWAP_CHAIN_USAGE_RENDER_TARGET) != SWAP_CHAIN_USAGE_NONE) {
    uStack_290 = uStack_290 | 0x12;
  }
  if ((SVar4 & SWAP_CHAIN_USAGE_SHADER_RESOURCE) != SWAP_CHAIN_USAGE_NONE) {
    uStack_290 = uStack_290 | 4;
  }
  if ((SVar4 & SWAP_CHAIN_USAGE_INPUT_ATTACHMENT) != SWAP_CHAIN_USAGE_NONE) {
    uStack_290 = uStack_290 | 0x80;
  }
  if ((SVar4 & SWAP_CHAIN_USAGE_COPY_SOURCE) != SWAP_CHAIN_USAGE_NONE) {
    uStack_290 = uStack_290 | 1;
  }
  VStack_28c = VK_SHARING_MODE_EXCLUSIVE;
  uStack_288 = 0;
  puStack_280 = (uint32_t *)0x0;
  local_2d0 = (local_260->m_LogicalVkDevice).
              super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
  pVVar7 = local_2d0->m_VkDevice;
  VVar14 = (*vkCreateSwapchainKHR)
                     (pVVar7,(VkSwapchainCreateInfoKHR *)local_2c8,(VkAllocationCallbacks *)0x0,
                      &this->m_VkSwapChain);
  if (VVar14 != VK_SUCCESS) {
    local_1f0._0_8_ = VulkanUtilities::VkResultToString(VVar14);
    in_stack_fffffffffffffcd8 = (string *)local_1f0;
    LogError<true,char[34],char[17],char_const*>
              (false,"CreateVulkanSwapChain",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/SwapChainVkImpl.cpp"
               ,0x1d3,(char (*) [34])"Failed to create Vulkan swapchain",
               (char (*) [17])"\nVK Error Code: ",(char **)in_stack_fffffffffffffcd8);
  }
  if (pVVar6 != (VkSwapchainKHR)0x0) {
    (*vkDestroySwapchainKHR)(pVVar7,pVVar6,(VkAllocationCallbacks *)0x0);
  }
  local_314 = 0;
  Args_1_03 = (char (*) [24])0x0;
  VVar14 = (*vkGetSwapchainImagesKHR)(pVVar7,this->m_VkSwapChain,&local_314,(VkImage *)0x0);
  psVar32 = (string *)local_1f0;
  if (VVar14 != VK_SUCCESS) {
    local_1f0._0_8_ = VulkanUtilities::VkResultToString(VVar14);
    Args_1_03 = (char (*) [24])0x1de;
    LogError<true,char[41],char[17],char_const*>
              (false,"CreateVulkanSwapChain",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/SwapChainVkImpl.cpp"
               ,0x1de,(char (*) [41])"Failed to request swap chain image count",
               (char (*) [17])"\nVK Error Code: ",(char **)psVar32);
    in_stack_fffffffffffffcd8 = psVar32;
  }
  if (local_314 == 0) {
    FormatString<char[26],char[24]>
              ((string *)local_1f0,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"swapchainImageCount > 0",Args_1_03);
    DebugAssertionFailed
              ((Char *)local_1f0._0_8_,"CreateVulkanSwapChain",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/SwapChainVkImpl.cpp"
               ,0x1df);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._0_8_ != paVar2) {
      operator_delete((void *)local_1f0._0_8_,local_1e0[0]._M_allocated_capacity + 1);
    }
  }
  if (local_314 != (this->super_SwapChainBase<Diligent::ISwapChainVk>).m_SwapChainDesc.BufferCount)
  {
    pUVar1 = &(this->super_SwapChainBase<Diligent::ISwapChainVk>).m_SwapChainDesc.BufferCount;
    FormatString<char[25],unsigned_int,char[12],unsigned_int,char[12]>
              ((string *)local_1f0,(Diligent *)"Created swap chain with ",(char (*) [25])&local_314,
               (uint *)" images vs ",(char (*) [12])pUVar1,(uint *)0x6ff93f,
               (char (*) [12])in_stack_fffffffffffffcd8);
    if (DebugMessageCallback != (undefined *)0x0) {
      (*(code *)DebugMessageCallback)(0,local_1f0._0_8_,0,0,0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._0_8_ != paVar2) {
      operator_delete((void *)local_1f0._0_8_,local_1e0[0]._M_allocated_capacity + 1);
    }
    *pUVar1 = local_314;
  }
  local_50 = &this->m_ImageAcquiredSemaphores;
  std::
  vector<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>_>_>
  ::resize(local_50,(ulong)local_314);
  this_00 = &this->m_DrawCompleteSemaphores;
  std::
  vector<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>_>_>
  ::resize(this_00,(ulong)local_314);
  if (local_314 != 0) {
    local_2d8 = local_170;
    lVar23 = 0;
    uVar21 = 0;
    do {
      local_68.sType = VK_STRUCTURE_TYPE_SEMAPHORE_CREATE_INFO;
      local_68._4_4_ = 0;
      local_68.pNext = (void *)0x0;
      local_68.flags = 0;
      local_68._20_4_ = 0;
      std::__cxx11::stringstream::stringstream((stringstream *)local_1f0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&((string *)local_1f0)->field_2,"Swap chain image acquired semaphore ",
                 0x24);
      std::ostream::_M_insert<unsigned_long>((ulong)&((string *)local_1f0)->field_2);
      std::__cxx11::stringbuf::str();
      VulkanUtilities::VulkanLogicalDevice::CreateSemaphore
                (&local_48,local_2d0,&local_68,(char *)local_2f8[0]);
      pRVar8 = (local_50->
               super__Vector_base<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_308.m_pObject =
           *(ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>
             **)((long)&pRVar8->m_pObject + lVar23);
      local_300 = (RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>
                   *)((long)&pRVar8->m_pObject + lVar23);
      ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>
      ::Create(local_260,&local_48,(char *)local_2f8[0],&local_308.m_pObject);
      pRVar11 = local_300;
      RVar10.m_pObject = local_308.m_pObject;
      if ((local_300 !=
           (RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>
            *)0x0) && (local_300->m_pObject != local_308.m_pObject)) {
        RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>
        ::Release(local_300);
        pRVar11->m_pObject = RVar10.m_pObject;
      }
      VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>
      ::~VulkanObjectWrapper(&local_48);
      if (local_2f8[0] != local_2e8) {
        operator_delete(local_2f8[0],local_2e8[0] + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1f0);
      std::ios_base::~ios_base(local_2d8);
      std::__cxx11::stringstream::stringstream((stringstream *)local_1f0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&((string *)local_1f0)->field_2,"Swap chain draw complete semaphore ",
                 0x23);
      std::ostream::_M_insert<unsigned_long>((ulong)&((string *)local_1f0)->field_2);
      std::__cxx11::stringbuf::str();
      VulkanUtilities::VulkanLogicalDevice::CreateSemaphore
                (&local_48,local_2d0,&local_68,(char *)local_2f8[0]);
      pRVar8 = (this_00->
               super__Vector_base<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_308.m_pObject =
           *(ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>
             **)((long)&pRVar8->m_pObject + lVar23);
      local_300 = (RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>
                   *)((long)&pRVar8->m_pObject + lVar23);
      ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>
      ::Create(local_260,&local_48,(char *)local_2f8[0],&local_308.m_pObject);
      pRVar11 = local_300;
      RVar10.m_pObject = local_308.m_pObject;
      if ((local_300 !=
           (RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>
            *)0x0) && (local_300->m_pObject != local_308.m_pObject)) {
        RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>
        ::Release(local_300);
        pRVar11->m_pObject = RVar10.m_pObject;
      }
      VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>
      ::~VulkanObjectWrapper(&local_48);
      if (local_2f8[0] != local_2e8) {
        operator_delete(local_2f8[0],local_2e8[0] + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1f0);
      std::ios_base::~ios_base(local_2d8);
      uVar21 = uVar21 + 1;
      lVar23 = lVar23 + 8;
    } while (uVar21 < local_314);
  }
  if (local_258.super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>._M_impl.
      super__Vector_impl_data._M_start != (VkPresentModeKHR *)0x0) {
    operator_delete(local_258.
                    super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_258.
                          super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_258.
                          super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if ((TextureFormatAttribs *)
      local_240.super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>._M_impl.
      super__Vector_impl_data._M_start != (TextureFormatAttribs *)0x0) {
    operator_delete(local_240.
                    super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_240.
                          super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_240.
                          super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void SwapChainVkImpl::CreateVulkanSwapChain()
{
    RenderDeviceVkImpl*                          pRenderDeviceVk = m_pRenderDevice.RawPtr<RenderDeviceVkImpl>();
    const VulkanUtilities::VulkanPhysicalDevice& PhysicalDevice  = pRenderDeviceVk->GetPhysicalDevice();
    VkPhysicalDevice                             vkDeviceHandle  = PhysicalDevice.GetVkDeviceHandle();
    // Get the list of VkFormats that are supported:
    uint32_t formatCount = 0;

    VkResult err = vkGetPhysicalDeviceSurfaceFormatsKHR(vkDeviceHandle, m_VkSurface, &formatCount, NULL);
    CHECK_VK_ERROR_AND_THROW(err, "Failed to query number of supported formats");
    VERIFY_EXPR(formatCount > 0);
    std::vector<VkSurfaceFormatKHR> SupportedFormats(formatCount);
    err = vkGetPhysicalDeviceSurfaceFormatsKHR(vkDeviceHandle, m_VkSurface, &formatCount, SupportedFormats.data());
    CHECK_VK_ERROR_AND_THROW(err, "Failed to query supported format properties");
    VERIFY_EXPR(formatCount == SupportedFormats.size());
    m_VkColorFormat = TexFormatToVkFormat(m_SwapChainDesc.ColorBufferFormat);

    VkColorSpaceKHR ColorSpace = VK_COLORSPACE_SRGB_NONLINEAR_KHR;
    if (formatCount == 1 && SupportedFormats[0].format == VK_FORMAT_UNDEFINED)
    {
        // If the format list includes just one entry of VK_FORMAT_UNDEFINED,
        // the surface has no preferred format.  Otherwise, at least one
        // supported format will be returned.

        // Do nothing
    }
    else
    {
        bool FmtFound = false;
        for (const VkSurfaceFormatKHR& SrfFmt : SupportedFormats)
        {
            if (SrfFmt.format == m_VkColorFormat)
            {
                FmtFound   = true;
                ColorSpace = SrfFmt.colorSpace;
                break;
            }
        }
        if (!FmtFound)
        {
            VkFormat VkReplacementColorFormat = VK_FORMAT_UNDEFINED;
            switch (m_VkColorFormat)
            {
                    // clang-format off
                case VK_FORMAT_R8G8B8A8_UNORM: VkReplacementColorFormat = VK_FORMAT_B8G8R8A8_UNORM; break;
                case VK_FORMAT_B8G8R8A8_UNORM: VkReplacementColorFormat = VK_FORMAT_R8G8B8A8_UNORM; break;
                case VK_FORMAT_B8G8R8A8_SRGB:  VkReplacementColorFormat = VK_FORMAT_R8G8B8A8_SRGB;  break;
                case VK_FORMAT_R8G8B8A8_SRGB:  VkReplacementColorFormat = VK_FORMAT_B8G8R8A8_SRGB;  break;
                default: VkReplacementColorFormat = VK_FORMAT_UNDEFINED;
                    // clang-format on
            }

            bool ReplacementFmtFound = false;
            for (const VkSurfaceFormatKHR& SrfFmt : SupportedFormats)
            {
                if (SrfFmt.format == VkReplacementColorFormat)
                {
                    ReplacementFmtFound = true;
                    ColorSpace          = SrfFmt.colorSpace;
                    break;
                }
            }

            if (ReplacementFmtFound)
            {
                m_VkColorFormat                     = VkReplacementColorFormat;
                TEXTURE_FORMAT NewColorBufferFormat = VkFormatToTexFormat(VkReplacementColorFormat);
                LOG_INFO_MESSAGE("Requested color buffer format ", GetTextureFormatAttribs(m_SwapChainDesc.ColorBufferFormat).Name, " is not supported by the surface and will be replaced with ", GetTextureFormatAttribs(NewColorBufferFormat).Name);
                m_SwapChainDesc.ColorBufferFormat = NewColorBufferFormat;
            }
            else
            {
                LOG_WARNING_MESSAGE("Requested color buffer format ", GetTextureFormatAttribs(m_SwapChainDesc.ColorBufferFormat).Name, "is not supported by the surface");
            }
        }
    }

    VkSurfaceCapabilitiesKHR surfCapabilities = {};

    err = vkGetPhysicalDeviceSurfaceCapabilitiesKHR(vkDeviceHandle, m_VkSurface, &surfCapabilities);
    CHECK_VK_ERROR_AND_THROW(err, "Failed to query physical device surface capabilities");

    uint32_t presentModeCount = 0;

    err = vkGetPhysicalDeviceSurfacePresentModesKHR(vkDeviceHandle, m_VkSurface, &presentModeCount, NULL);
    CHECK_VK_ERROR_AND_THROW(err, "Failed to query surface present mode count");
    VERIFY_EXPR(presentModeCount > 0);
    std::vector<VkPresentModeKHR> presentModes(presentModeCount);
    err = vkGetPhysicalDeviceSurfacePresentModesKHR(vkDeviceHandle, m_VkSurface, &presentModeCount, presentModes.data());
    CHECK_VK_ERROR_AND_THROW(err, "Failed to query surface present modes");
    VERIFY_EXPR(presentModeCount == presentModes.size());


    VkSurfaceTransformFlagBitsKHR vkPreTransform = VK_SURFACE_TRANSFORM_IDENTITY_BIT_KHR;
    if (m_DesiredPreTransform != SURFACE_TRANSFORM_OPTIMAL)
    {
        vkPreTransform = SurfaceTransformToVkSurfaceTransformFlag(m_DesiredPreTransform);
        if ((surfCapabilities.supportedTransforms & vkPreTransform) != 0)
        {
            m_SwapChainDesc.PreTransform = m_DesiredPreTransform;
        }
        else
        {
            LOG_WARNING_MESSAGE(GetSurfaceTransformString(m_DesiredPreTransform),
                                " is not supported by the presentation engine. Optimal surface transform will be used instead."
                                " Query the swap chain description to get the actual surface transform.");
            m_DesiredPreTransform = SURFACE_TRANSFORM_OPTIMAL;
        }
    }

    if (m_DesiredPreTransform == SURFACE_TRANSFORM_OPTIMAL)
    {
        // Use current surface transform to avoid extra cost of presenting the image.
        // If preTransform does not match the currentTransform value returned by vkGetPhysicalDeviceSurfaceCapabilitiesKHR,
        // the presentation engine will transform the image content as part of the presentation operation.
        // https://android-developers.googleblog.com/2020/02/handling-device-orientation-efficiently.html
        // https://community.arm.com/developer/tools-software/graphics/b/blog/posts/appropriate-use-of-surface-rotation
        vkPreTransform               = surfCapabilities.currentTransform;
        m_SwapChainDesc.PreTransform = VkSurfaceTransformFlagToSurfaceTransform(vkPreTransform);
        LOG_INFO_MESSAGE("Using ", GetSurfaceTransformString(m_SwapChainDesc.PreTransform), " swap chain pretransform");
    }

    VkExtent2D swapchainExtent = {};
    // width and height are either both 0xFFFFFFFF, or both not 0xFFFFFFFF.
    if (surfCapabilities.currentExtent.width == 0xFFFFFFFF && m_SwapChainDesc.Width != 0 && m_SwapChainDesc.Height != 0)
    {
        // If the surface size is undefined, the size is set to
        // the size of the images requested.
        swapchainExtent.width  = std::min(std::max(m_SwapChainDesc.Width, surfCapabilities.minImageExtent.width), surfCapabilities.maxImageExtent.width);
        swapchainExtent.height = std::min(std::max(m_SwapChainDesc.Height, surfCapabilities.minImageExtent.height), surfCapabilities.maxImageExtent.height);
    }
    else
    {
        // If the surface size is defined, the swap chain size must match
        swapchainExtent = surfCapabilities.currentExtent;
    }

#if PLATFORM_ANDROID
    // On Android, vkGetPhysicalDeviceSurfaceCapabilitiesKHR is not reliable and starts reporting incorrect
    // dimensions after few rotations. To alleviate the problem, we store the surface extent corresponding to
    // identity rotation.
    // https://android-developers.googleblog.com/2020/02/handling-device-orientation-efficiently.html
    if (m_SurfaceIdentityExtent.width == 0 || m_SurfaceIdentityExtent.height == 0)
    {
        m_SurfaceIdentityExtent = surfCapabilities.currentExtent;
        constexpr auto Rotate90TransformFlags =
            VK_SURFACE_TRANSFORM_ROTATE_90_BIT_KHR |
            VK_SURFACE_TRANSFORM_ROTATE_270_BIT_KHR |
            VK_SURFACE_TRANSFORM_HORIZONTAL_MIRROR_ROTATE_90_BIT_KHR |
            VK_SURFACE_TRANSFORM_HORIZONTAL_MIRROR_ROTATE_270_BIT_KHR;
        if ((surfCapabilities.currentTransform & Rotate90TransformFlags) != 0)
            std::swap(m_SurfaceIdentityExtent.width, m_SurfaceIdentityExtent.height);
    }

    if (m_DesiredPreTransform == SURFACE_TRANSFORM_OPTIMAL)
    {
        swapchainExtent = m_SurfaceIdentityExtent;
    }
    m_CurrentSurfaceTransform = surfCapabilities.currentTransform;
#endif

    swapchainExtent.width  = std::max(swapchainExtent.width, 1u);
    swapchainExtent.height = std::max(swapchainExtent.height, 1u);
    m_SwapChainDesc.Width  = swapchainExtent.width;
    m_SwapChainDesc.Height = swapchainExtent.height;

    // The FIFO present mode is guaranteed by the spec to always be supported.
    VkPresentModeKHR PresentMode = VK_PRESENT_MODE_FIFO_KHR;
    {
        std::vector<VkPresentModeKHR> PreferredPresentModes;
        if (m_VSyncEnabled)
        {
            // FIFO relaxed waits for the next VSync, but if the frame is late,
            // it still shows it even if VSync has already passed, which may
            // result in tearing.
            PreferredPresentModes.push_back(VK_PRESENT_MODE_FIFO_RELAXED_KHR);
            PreferredPresentModes.push_back(VK_PRESENT_MODE_FIFO_KHR);
        }
        else
        {
            // Mailbox is the lowest latency non-tearing presentation mode.
            PreferredPresentModes.push_back(VK_PRESENT_MODE_MAILBOX_KHR);
            PreferredPresentModes.push_back(VK_PRESENT_MODE_IMMEDIATE_KHR);
            PreferredPresentModes.push_back(VK_PRESENT_MODE_FIFO_KHR);
        }

        for (VkPresentModeKHR PreferredMode : PreferredPresentModes)
        {
            if (std::find(presentModes.begin(), presentModes.end(), PreferredMode) != presentModes.end())
            {
                PresentMode = PreferredMode;
                break;
            }
        }

        const char* PresentModeName = nullptr;
#define PRESENT_MODE_CASE(Mode) \
    case Mode: PresentModeName = #Mode; break;
        switch (PresentMode)
        {
            PRESENT_MODE_CASE(VK_PRESENT_MODE_IMMEDIATE_KHR)
            PRESENT_MODE_CASE(VK_PRESENT_MODE_MAILBOX_KHR)
            PRESENT_MODE_CASE(VK_PRESENT_MODE_FIFO_KHR)
            PRESENT_MODE_CASE(VK_PRESENT_MODE_FIFO_RELAXED_KHR)
            PRESENT_MODE_CASE(VK_PRESENT_MODE_SHARED_DEMAND_REFRESH_KHR)
            PRESENT_MODE_CASE(VK_PRESENT_MODE_SHARED_CONTINUOUS_REFRESH_KHR)
            default: PresentModeName = "<UNKNOWN>";
        }
#undef PRESENT_MODE_CASE
        LOG_INFO_MESSAGE("Using ", PresentModeName, " swap chain present mode");
    }

    // Determine the number of VkImage's to use in the swap chain.
    // We need to acquire only 1 presentable image at at time.
    // Asking for minImageCount images ensures that we can acquire
    // 1 presentable image as long as we present it before attempting
    // to acquire another.
    if (m_DesiredBufferCount < surfCapabilities.minImageCount)
    {
        LOG_INFO_MESSAGE("Desired back buffer count (", m_DesiredBufferCount, ") is smaller than the minimal image count supported for this surface (", surfCapabilities.minImageCount, "). Resetting to ", surfCapabilities.minImageCount);
        m_DesiredBufferCount = surfCapabilities.minImageCount;
    }
    if (surfCapabilities.maxImageCount != 0 && m_DesiredBufferCount > surfCapabilities.maxImageCount)
    {
        LOG_INFO_MESSAGE("Desired back buffer count (", m_DesiredBufferCount, ") is greater than the maximal image count supported for this surface (", surfCapabilities.maxImageCount, "). Resetting to ", surfCapabilities.maxImageCount);
        m_DesiredBufferCount = surfCapabilities.maxImageCount;
    }
    // We must use m_DesiredBufferCount instead of m_SwapChainDesc.BufferCount, because Vulkan on Android
    // may decide to always add extra buffers, causing infinite growth of the swap chain when it is recreated:
    //                          m_SwapChainDesc.BufferCount
    // CreateVulkanSwapChain()          2 -> 4
    // CreateVulkanSwapChain()          4 -> 6
    // CreateVulkanSwapChain()          6 -> 8
    uint32_t desiredNumberOfSwapChainImages = m_DesiredBufferCount;

    // Find a supported composite alpha mode - one of these is guaranteed to be set
    VkCompositeAlphaFlagBitsKHR compositeAlpha         = VK_COMPOSITE_ALPHA_OPAQUE_BIT_KHR;
    VkCompositeAlphaFlagBitsKHR compositeAlphaFlags[4] = //
        {
            VK_COMPOSITE_ALPHA_OPAQUE_BIT_KHR,
            VK_COMPOSITE_ALPHA_PRE_MULTIPLIED_BIT_KHR,
            VK_COMPOSITE_ALPHA_POST_MULTIPLIED_BIT_KHR,
            VK_COMPOSITE_ALPHA_INHERIT_BIT_KHR,
        };
    for (uint32_t i = 0; i < _countof(compositeAlphaFlags); i++)
    {
        if (surfCapabilities.supportedCompositeAlpha & compositeAlphaFlags[i])
        {
            compositeAlpha = compositeAlphaFlags[i];
            break;
        }
    }

    VkSwapchainKHR oldSwapchain = m_VkSwapChain;
    m_VkSwapChain               = VK_NULL_HANDLE;

    VkSwapchainCreateInfoKHR swapchain_ci = {};

    swapchain_ci.sType              = VK_STRUCTURE_TYPE_SWAPCHAIN_CREATE_INFO_KHR;
    swapchain_ci.pNext              = NULL;
    swapchain_ci.surface            = m_VkSurface;
    swapchain_ci.minImageCount      = desiredNumberOfSwapChainImages;
    swapchain_ci.imageFormat        = m_VkColorFormat;
    swapchain_ci.imageExtent.width  = swapchainExtent.width;
    swapchain_ci.imageExtent.height = swapchainExtent.height;
    swapchain_ci.preTransform       = vkPreTransform;
    swapchain_ci.compositeAlpha     = compositeAlpha;
    swapchain_ci.imageArrayLayers   = 1;
    swapchain_ci.presentMode        = PresentMode;
    swapchain_ci.oldSwapchain       = oldSwapchain;
    swapchain_ci.clipped            = VK_TRUE;
    swapchain_ci.imageColorSpace    = ColorSpace;

    DEV_CHECK_ERR(m_SwapChainDesc.Usage != 0, "No swap chain usage flags defined");
    static_assert(SWAP_CHAIN_USAGE_LAST == 8, "Please update this function to handle the new swapchain usage");
    if (m_SwapChainDesc.Usage & SWAP_CHAIN_USAGE_RENDER_TARGET)
        swapchain_ci.imageUsage |= VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT | VK_IMAGE_USAGE_TRANSFER_DST_BIT;
    if (m_SwapChainDesc.Usage & SWAP_CHAIN_USAGE_SHADER_RESOURCE)
        swapchain_ci.imageUsage |= VK_IMAGE_USAGE_SAMPLED_BIT;
    if (m_SwapChainDesc.Usage & SWAP_CHAIN_USAGE_INPUT_ATTACHMENT)
        swapchain_ci.imageUsage |= VK_IMAGE_USAGE_INPUT_ATTACHMENT_BIT;
    if (m_SwapChainDesc.Usage & SWAP_CHAIN_USAGE_COPY_SOURCE)
        swapchain_ci.imageUsage |= VK_IMAGE_USAGE_TRANSFER_SRC_BIT;

    // vkCmdClearColorImage() command requires the image to use VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL layout
    // that requires  VK_IMAGE_USAGE_TRANSFER_DST_BIT to be set
    swapchain_ci.imageSharingMode      = VK_SHARING_MODE_EXCLUSIVE;
    swapchain_ci.queueFamilyIndexCount = 0;
    swapchain_ci.pQueueFamilyIndices   = NULL;
    //uint32_t queueFamilyIndices[] = { (uint32_t)info.graphics_queue_family_index, (uint32_t)info.present_queue_family_index };
    //if (info.graphics_queue_family_index != info.present_queue_family_index) {
    //    // If the graphics and present queues are from different queue families,
    //    // we either have to explicitly transfer ownership of images between
    //    // the queues, or we have to create the swapchain with imageSharingMode
    //    // as VK_SHARING_MODE_CONCURRENT
    //    swapchain_ci.imageSharingMode = VK_SHARING_MODE_CONCURRENT;
    //    swapchain_ci.queueFamilyIndexCount = 2;
    //    swapchain_ci.pQueueFamilyIndices = queueFamilyIndices;
    //}

    const VulkanUtilities::VulkanLogicalDevice& LogicalDevice = pRenderDeviceVk->GetLogicalDevice();
    VkDevice                                    vkDevice      = pRenderDeviceVk->GetVkDevice();

    err = vkCreateSwapchainKHR(vkDevice, &swapchain_ci, NULL, &m_VkSwapChain);
    CHECK_VK_ERROR_AND_THROW(err, "Failed to create Vulkan swapchain");

    if (oldSwapchain != VK_NULL_HANDLE)
    {
        vkDestroySwapchainKHR(vkDevice, oldSwapchain, NULL);
        oldSwapchain = VK_NULL_HANDLE;
    }

    uint32_t swapchainImageCount = 0;

    err = vkGetSwapchainImagesKHR(vkDevice, m_VkSwapChain, &swapchainImageCount, NULL);
    CHECK_VK_ERROR_AND_THROW(err, "Failed to request swap chain image count");
    VERIFY_EXPR(swapchainImageCount > 0);
    if (swapchainImageCount != m_SwapChainDesc.BufferCount)
    {
        LOG_INFO_MESSAGE("Created swap chain with ", swapchainImageCount,
                         " images vs ", m_SwapChainDesc.BufferCount, " requested.");
        m_SwapChainDesc.BufferCount = swapchainImageCount;
    }

    m_ImageAcquiredSemaphores.resize(swapchainImageCount);
    m_DrawCompleteSemaphores.resize(swapchainImageCount);
    for (uint32_t i = 0; i < swapchainImageCount; ++i)
    {
        VkSemaphoreCreateInfo SemaphoreCI = {};

        SemaphoreCI.sType = VK_STRUCTURE_TYPE_SEMAPHORE_CREATE_INFO;
        SemaphoreCI.pNext = nullptr;
        SemaphoreCI.flags = 0; // reserved for future use

        {
            std::stringstream ss;
            ss << "Swap chain image acquired semaphore " << i;
            const std::string                 Name      = ss.str();
            VulkanUtilities::SemaphoreWrapper Semaphore = LogicalDevice.CreateSemaphore(SemaphoreCI, Name.c_str());
            ManagedSemaphore::Create(pRenderDeviceVk, std::move(Semaphore), Name.c_str(), &m_ImageAcquiredSemaphores[i]);
        }

        {
            std::stringstream ss;
            ss << "Swap chain draw complete semaphore " << i;
            const std::string                 Name      = ss.str();
            VulkanUtilities::SemaphoreWrapper Semaphore = LogicalDevice.CreateSemaphore(SemaphoreCI, Name.c_str());
            ManagedSemaphore::Create(pRenderDeviceVk, std::move(Semaphore), Name.c_str(), &m_DrawCompleteSemaphores[i]);
        }
    }
}